

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void * duckdb_je_arena_palloc
                 (tsdn_t *tsdn,arena_t *arena,size_t usize,size_t alignment,_Bool zero,_Bool slab,
                 tcache_t *tcache)

{
  void **ppvVar1;
  void **ppvVar2;
  szind_t sVar3;
  ulong uVar4;
  arena_t *arena_00;
  void *pvVar5;
  undefined7 in_register_00000089;
  cache_bin_t *cache_bin;
  _Bool local_3d;
  szind_t local_3c;
  ulong local_38;
  
  if ((int)CONCAT71(in_register_00000089,slab) == 0) {
    if (alignment < 0x41) {
      pvVar5 = duckdb_je_large_malloc(tsdn,arena,usize,zero);
      return pvVar5;
    }
    pvVar5 = duckdb_je_large_palloc(tsdn,arena,usize,alignment,zero);
    return pvVar5;
  }
  if (usize < 0x1001) {
    uVar4 = (ulong)duckdb_je_sz_size2index_tab[usize + 7 >> 3];
  }
  else {
    sVar3 = sz_size2index_compute(usize);
    uVar4 = (ulong)sVar3;
  }
  if (tcache == (tcache_t *)0x0) {
    pvVar5 = duckdb_je_arena_malloc_hard(tsdn,arena,usize,(szind_t)uVar4,zero,true);
    return pvVar5;
  }
  cache_bin = tcache->bins + uVar4;
  ppvVar2 = cache_bin->stack_head;
  pvVar5 = *ppvVar2;
  ppvVar1 = ppvVar2 + 1;
  if (cache_bin->low_bits_low_water == (uint16_t)ppvVar2) {
    if (cache_bin->low_bits_empty == cache_bin->low_bits_low_water) {
      local_3c = (szind_t)uVar4;
      local_38 = uVar4;
      arena_00 = arena_choose(&tsdn->tsd,arena);
      sVar3 = local_3c;
      if (arena_00 != (arena_t *)0x0) {
        if (cache_bin->stack_head == (void **)&duckdb_je_disabled_bin) {
          pvVar5 = duckdb_je_arena_malloc_hard(tsdn,arena_00,usize,local_3c,zero,true);
          return pvVar5;
        }
        duckdb_je_tcache_bin_flush_stashed(&tsdn->tsd,tcache,cache_bin,local_3c,true);
        pvVar5 = duckdb_je_tcache_alloc_small_hard(tsdn,arena_00,tcache,cache_bin,sVar3,&local_3d);
        uVar4 = local_38;
        if (local_3d != false) goto LAB_0115b592;
      }
      return (void *)0x0;
    }
    cache_bin->stack_head = ppvVar1;
    cache_bin->low_bits_low_water = (uint16_t)ppvVar1;
  }
  else {
    cache_bin->stack_head = ppvVar1;
  }
LAB_0115b592:
  if (zero) {
    switchD_005681f0::default(pvVar5,0,duckdb_je_sz_index2size_tab[uVar4]);
  }
  (cache_bin->tstats).nrequests = (cache_bin->tstats).nrequests + 1;
  return pvVar5;
}

Assistant:

void *
arena_palloc(tsdn_t *tsdn, arena_t *arena, size_t usize, size_t alignment,
    bool zero, bool slab, tcache_t *tcache) {
	if (slab) {
		assert(sz_can_use_slab(usize));
		/* Small; alignment doesn't require special slab placement. */

		/* usize should be a result of sz_sa2u() */
		assert((usize & (alignment - 1)) == 0);

		/*
		 * Small usize can't come from an alignment larger than a page.
		 */
		assert(alignment <= PAGE);

		return arena_malloc(tsdn, arena, usize, sz_size2index(usize),
		    zero, slab, tcache, true);
	} else {
		if (likely(alignment <= CACHELINE)) {
			return large_malloc(tsdn, arena, usize, zero);
		} else {
			return large_palloc(tsdn, arena, usize, alignment, zero);
		}
	}
}